

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int prepare_stream_state_sender
              (quicly_stream_t *stream,quicly_sender_state_t *sender,quicly_send_context_t *s,
              size_t min_space,quicly_sent_acked_cb ack_cb)

{
  int iVar1;
  quicly_sent_t *in_RAX;
  quicly_sent_t *sent;
  quicly_sent_t *local_18;
  
  local_18 = in_RAX;
  iVar1 = allocate_ack_eliciting_frame(stream->conn,s,min_space,&local_18,ack_cb);
  if (iVar1 == 0) {
    (local_18->data).packet.packet_number = stream->stream_id;
    *sender = QUICLY_SENDER_STATE_UNACKED;
  }
  return iVar1;
}

Assistant:

static int prepare_stream_state_sender(quicly_stream_t *stream, quicly_sender_state_t *sender, quicly_send_context_t *s,
                                       size_t min_space, quicly_sent_acked_cb ack_cb)
{
    quicly_sent_t *sent;
    int ret;

    if ((ret = allocate_ack_eliciting_frame(stream->conn, s, min_space, &sent, ack_cb)) != 0)
        return ret;
    sent->data.stream_state_sender.stream_id = stream->stream_id;
    *sender = QUICLY_SENDER_STATE_UNACKED;

    return 0;
}